

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O3

bool __thiscall ObjDumpParser::parseFunctionDecl(ObjDumpParser *this,char **data,size_t size)

{
  char *__nptr;
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  char *begin;
  
  __nptr = *data;
  uVar3 = strtoul(__nptr,data,0x10);
  if ((((uVar3 != 0) && (pcVar1 = *data, *pcVar1 == ' ')) && (pcVar1[1] == '<')) &&
     ((*data = pcVar1 + 2, __nptr[size - 2] == '>' && (__nptr[size - 1] == ':')))) {
    __nptr[size - 2] = '\0';
    bVar2 = ScParser::parseFunctionDecl(this->m_scParser,data);
    return bVar2;
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionDecl(char *&data, std::size_t size)
{
    char *const endOfData = data + size - 2;

    if (!(expectAddress(data) && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">:")) {
        return false;
    }
    *endOfData = 0;

    return m_scParser.parseFunctionDecl(data);
}